

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O3

FlagBase * __thiscall
args::
MapFlagList<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MappingEnum,_args::detail::vector,_args::ValueReader,_args::detail::unordered_map>
::Match(MapFlagList<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MappingEnum,_args::detail::vector,_args::ValueReader,_args::detail::unordered_map>
        *this,EitherFlag *arg)

{
  pointer pMVar1;
  int iVar2;
  FlagBase *pFVar3;
  
  iVar2 = (*(this->super_ValueFlagBase).super_FlagBase.super_NamedBase.super_Base._vptr_Base[2])();
  pFVar3 = FlagBase::Match((FlagBase *)this,arg);
  if ((pFVar3 != (FlagBase *)0x0 && (char)iVar2 == '\0') &&
     (pMVar1 = (this->values).super__Vector_base<MappingEnum,_std::allocator<MappingEnum>_>._M_impl.
               super__Vector_impl_data._M_start,
     (this->values).super__Vector_base<MappingEnum,_std::allocator<MappingEnum>_>._M_impl.
     super__Vector_impl_data._M_finish != pMVar1)) {
    (this->values).super__Vector_base<MappingEnum,_std::allocator<MappingEnum>_>._M_impl.
    super__Vector_impl_data._M_finish = pMVar1;
  }
  return pFVar3;
}

Assistant:

virtual FlagBase *Match(const EitherFlag &arg) override
            {
                const bool wasMatched = Matched();
                auto me = FlagBase::Match(arg);
                if (me && !wasMatched)
                {
                    values.clear();
                }
                return me;
            }